

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_utils.c
# Opt level: O2

void VP8InitRandom(VP8Random *rg,float dithering)

{
  int iVar1;
  int iVar2;
  
  memcpy(rg->tab_,kRandomTable,0xdc);
  rg->index1_ = 0;
  rg->index2_ = 0x1f;
  iVar2 = 0x100;
  if (dithering <= 1.0) {
    iVar2 = (int)(long)(dithering * 256.0);
  }
  iVar1 = 0;
  if (0.0 <= dithering) {
    iVar1 = iVar2;
  }
  rg->amp_ = iVar1;
  return;
}

Assistant:

void VP8InitRandom(VP8Random* const rg, float dithering) {
  memcpy(rg->tab_, kRandomTable, sizeof(rg->tab_));
  rg->index1_ = 0;
  rg->index2_ = 31;
  rg->amp_ = (dithering < 0.0) ? 0
           : (dithering > 1.0) ? (1 << VP8_RANDOM_DITHER_FIX)
           : (uint32_t)((1 << VP8_RANDOM_DITHER_FIX) * dithering);
}